

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int luaL_typerror(lua_State *L,int narg,char *tname)

{
  int iVar1;
  char *pcVar2;
  undefined8 in_RDX;
  lua_State *in_RDI;
  char *msg;
  char *in_stack_00000038;
  int in_stack_00000044;
  lua_State *in_stack_00000048;
  lua_State *in_stack_ffffffffffffffe0;
  
  iVar1 = lua_type(in_stack_ffffffffffffffe0,(int)((ulong)in_RDX >> 0x20));
  pcVar2 = lua_typename(in_RDI,iVar1);
  lua_pushfstring(in_RDI,"%s expected, got %s",in_RDX,pcVar2);
  iVar1 = luaL_argerror(in_stack_00000048,in_stack_00000044,in_stack_00000038);
  return iVar1;
}

Assistant:

static int luaL_typerror(lua_State*L,int narg,const char*tname){
const char*msg=lua_pushfstring(L,"%s expected, got %s",
tname,luaL_typename(L,narg));
return luaL_argerror(L,narg,msg);
}